

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_block.cpp
# Opt level: O1

void multikey_block<1024u,unsigned_char>(uchar **strings,size_t n,size_t depth)

{
  size_t *psVar1;
  _List_node_base *__dest;
  allocator_type aVar2;
  _List_node_base *__dest_00;
  pointer ppppuVar3;
  size_t n_00;
  size_t n_01;
  size_t depth_00;
  allocator_type aVar4;
  uint j;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uchar **ppuVar11;
  ulong uVar12;
  _List_node_base *p_Var13;
  ulong uVar14;
  array<unsigned_long,_3UL> bucketsize;
  array<unsigned_char,_32UL> cache;
  _List_node_base *local_d8;
  vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> local_c8;
  _List_node_base *local_a8;
  _List_node_base *local_a0;
  _List_node_base *local_98;
  size_t local_90;
  ulong local_88;
  size_t sStack_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  long local_58;
  allocator_type local_50 [32];
  
  if (n < 10000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  if (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
      buckets_abi_cxx11_ == '\0') {
    multikey_block<1024u,unsigned_char>();
  }
  if (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_ == '\0') {
    multikey_block<1024u,unsigned_char>();
  }
  aVar4 = (allocator_type)pseudo_median<unsigned_char>(strings,n,depth);
  std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
            (&local_c8,(n >> 10) + 1,local_50);
  local_88 = 0;
  sStack_80 = 0;
  local_78 = 0;
  p_Var5 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[0].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)
                   &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_) {
    p_Var6 = (((list<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)&p_Var5->_M_next)->
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var6;
  }
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_;
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_;
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  p_Var5 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[1].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)
                   (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems + 1)) {
    p_Var6 = p_Var5->_M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var6;
  }
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 1);
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 1);
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  p_Var5 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[2].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)
                   (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems + 2)) {
    p_Var6 = p_Var5->_M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var6;
  }
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 2);
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 2);
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  if (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)
      &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
       freeblocks_abi_cxx11_) {
    __assert_fail("freeblocks.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                  ,0x54,
                  "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned char]"
                 );
  }
  lVar10 = 0;
  multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
  freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        freeblocks_abi_cxx11_;
  do {
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next =
         (_List_node_base *)
         ((long)multikey_block<1024U,_unsigned_char>::temp_space._M_elems + lVar10);
    std::__detail::_List_node_base::_M_hook(p_Var5);
    multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
    freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl._M_node._M_size =
         multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
         freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
         ._M_impl._M_node._M_size + 1;
    lVar10 = lVar10 + 0x2000;
  } while (lVar10 != 0x40000);
  if ((n & 0xfffffffffffffc00) != 0) {
    uVar12 = 0;
    p_Var5 = (_List_node_base *)strings;
    do {
      p_Var6 = (_List_node_base *)operator_new(0x18);
      p_Var6[1]._M_next = p_Var5;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node._M_size =
           multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
           freeblocks_abi_cxx11_.
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           _M_size + 1;
      uVar12 = uVar12 + 0x400;
      p_Var5 = p_Var5 + 0x200;
    } while (uVar12 < (n & 0xfffffffffffffc00));
  }
  local_a8 = (_List_node_base *)(n & 0xffffffffffffffe0);
  local_90 = depth;
  if (local_a8 == (_List_node_base *)0x0) {
    p_Var5 = (_List_node_base *)0x0;
  }
  else {
    local_98 = (_List_node_base *)(strings + n);
    p_Var5 = (_List_node_base *)0x0;
    ppuVar11 = strings;
    do {
      lVar10 = 0;
      do {
        if (ppuVar11[lVar10] == (uchar *)0x0) goto LAB_00220692;
        local_50[lVar10] = *(allocator_type *)(ppuVar11[lVar10] + depth);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      lVar10 = 0;
      local_a0 = p_Var5;
      do {
        p_Var5 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
                 freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        lVar9 = (ulong)(local_50[lVar10] == aVar4) +
                (ulong)((byte)aVar4 < (byte)local_50[lVar10]) * 2;
        uVar12 = (&local_88)[lVar9];
        uVar14 = uVar12 & 0x3ff;
        if (uVar14 == 0) {
          if (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              super__List_node_base._M_next ==
              (_List_node_base *)
              &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
               freeblocks_abi_cxx11_) goto LAB_00220673;
          p_Var6 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                   ::freeblocks_abi_cxx11_.
                   super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   _M_node.super__List_node_base._M_next[1]._M_next;
          multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_.
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var5);
          p_Var5 = (_List_node_base *)operator_new(0x18);
          p_Var5[1]._M_next = p_Var6;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems[lVar9].
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          depth = local_90;
          if (p_Var6 < local_98 && strings <= p_Var6) {
            lVar7 = (long)p_Var6 - (long)strings >> 3;
            lVar8 = lVar7 + 0x3ff;
            if (-1 < lVar7) {
              lVar8 = lVar7;
            }
            local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar8 >> 10] =
                 (uchar ***)
                 (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
                  buckets_abi_cxx11_._M_elems[lVar9].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_prev + 1);
          }
        }
        if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
             &((_List_node_base *)
              (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
               buckets_abi_cxx11_._M_elems + lVar9))->_M_next)->_M_impl)._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + lVar9)) {
          __assert_fail("not buckets[b].empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x6e,
                        "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned char]"
                       );
        }
        (&(multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[lVar9].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar14] =
             (_List_node_base *)ppuVar11[lVar10];
        (&local_88)[lVar9] = uVar12 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      p_Var5 = local_a0 + 2;
      ppuVar11 = ppuVar11 + 0x20;
    } while (p_Var5 < local_a8);
  }
  if (p_Var5 < n) {
    do {
      p_Var6 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
               freeblocks_abi_cxx11_.
               super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node
               .super__List_node_base._M_next;
      if (strings[(long)p_Var5] == (uchar *)0x0) {
LAB_00220692:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      aVar2 = *(allocator_type *)(strings[(long)p_Var5] + depth);
      lVar10 = (ulong)(aVar2 == aVar4) + (ulong)((byte)aVar4 <= (byte)aVar2 && aVar2 != aVar4) * 2;
      uVar12 = (&local_88)[lVar10];
      uVar14 = uVar12 & 0x3ff;
      if (uVar14 == 0) {
        if (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_.
            super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_) {
LAB_00220673:
          __assert_fail("not fb.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x3a,"Block take_free_block(FreeBlocks &)");
        }
        p_Var13 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
                  freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_next[1]._M_next;
        multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
        freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
        _M_impl._M_node._M_size =
             multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             _M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6);
        p_Var6 = (_List_node_base *)operator_new(0x18);
        p_Var6[1]._M_next = p_Var13;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
                  buckets_abi_cxx11_._M_elems[lVar10].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        depth = local_90;
        if (p_Var13 < (_List_node_base *)(strings + n) && strings <= p_Var13) {
          lVar8 = (long)p_Var13 - (long)strings >> 3;
          lVar9 = lVar8 + 0x3ff;
          if (-1 < lVar8) {
            lVar9 = lVar8;
          }
          local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
          .super__Vector_impl_data._M_start[lVar9 >> 10] =
               (uchar ***)
               (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
                buckets_abi_cxx11_._M_elems[lVar10].
                super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                _M_node.super__List_node_base._M_prev + 1);
        }
      }
      if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
           &((_List_node_base *)
            (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + lVar10))->_M_next)->_M_impl)._M_node.
          super__List_node_base._M_next ==
          (_List_node_base *)
          (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems + lVar10)) {
        __assert_fail("not buckets[b].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                      ,0x80,
                      "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned char]"
                     );
      }
      (&(multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
         buckets_abi_cxx11_._M_elems[lVar10].
         super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
         super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar14] =
           (_List_node_base *)strings[(long)p_Var5];
      (&local_88)[lVar10] = uVar12 + 1;
      p_Var5 = (_List_node_base *)((long)&p_Var5->_M_next + 1);
    } while ((_List_node_base *)n != p_Var5);
  }
  local_60 = local_88;
  local_68 = sStack_80;
  local_70 = local_78;
  if (local_88 + sStack_80 + local_78 != n) {
    __assert_fail("bucketsize[0]+bucketsize[1]+bucketsize[2]==n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                  ,0x84,
                  "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned char]"
                 );
  }
  p_Var5 = (_List_node_base *)(strings + n);
  lVar10 = 0;
  uVar12 = 0;
  local_a0 = p_Var5;
  do {
    p_Var6 = (_List_node_base *)(&local_88)[lVar10];
    local_58 = lVar10;
    if (p_Var6 != (_List_node_base *)0x0) {
      local_d8 = (_List_node_base *)
                 (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
                  buckets_abi_cxx11_._M_elems + lVar10);
      p_Var13 = (_List_node_base *)0x0;
      local_a8 = p_Var6;
      do {
        uVar14 = (long)p_Var6 - (long)p_Var13;
        if (0x3ff < uVar14) {
          uVar14 = 0x400;
        }
        local_d8 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                    &local_d8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        __dest = (_List_node_base *)(strings + uVar12);
        if (local_d8[1]._M_next == __dest) {
          if ((uVar12 & 0x3ff) != 0) {
            __assert_fail("pos%B==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                          ,0x92,
                          "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned char]"
                         );
          }
          *(undefined8 *)
           ((long)local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar12 >> 7)) = 0;
        }
        else {
          p_Var6 = (_List_node_base *)((uVar14 + uVar12) - 1 >> 10);
          if (local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[(long)p_Var6] != (uchar ***)0x0) {
            do {
              local_98 = p_Var6;
              p_Var5 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                       ::freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next;
              if (multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
                  freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_next ==
                  (_List_node_base *)
                  &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                   ::freeblocks_abi_cxx11_) goto LAB_00220673;
              __dest_00 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                          ::freeblocks_abi_cxx11_.
                          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl._M_node.super__List_node_base._M_next[1]._M_next;
              multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              _M_size = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                        ::freeblocks_abi_cxx11_.
                        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl._M_node._M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var5);
              p_Var5 = local_98;
              ppppuVar3 = local_c8.
                          super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            } while ((strings <= __dest_00) && (p_Var6 = local_98, __dest_00 < __dest));
            if (__dest_00 < local_a0 && strings <= __dest_00) {
              lVar9 = (long)__dest_00 - (long)strings >> 3;
              lVar10 = lVar9 + 0x3ff;
              if (-1 < lVar9) {
                lVar10 = lVar9;
              }
              if (local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar10 >> 10] != (uchar ***)0x0) {
                __assert_fail("backlinks[(tmp-strings)/B]==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                              ,0xa2,
                              "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned char]"
                             );
              }
              local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar10 >> 10] =
                   local_c8.
                   super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
                   .super__Vector_impl_data._M_start[(long)local_98];
            }
            memcpy(__dest_00,
                   *local_c8.
                    super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)local_98],0x2000);
            *ppppuVar3[(long)p_Var5] = (uchar **)__dest_00;
            local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)p_Var5] = (uchar ***)0x0;
            p_Var5 = local_a0;
          }
          p_Var6 = local_d8[1]._M_next;
          if (p_Var6 < p_Var5 && strings <= p_Var6) {
            if (p_Var6 <= __dest) {
              __assert_fail("*it > strings+pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                            ,0xaa,
                            "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned char]"
                           );
            }
            lVar9 = (long)p_Var6 - (long)strings >> 3;
            lVar10 = lVar9 + 0x3ff;
            if (-1 < lVar9) {
              lVar10 = lVar9;
            }
            local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10 >> 10] = (uchar ***)0x0;
          }
          memcpy(__dest,local_d8[1]._M_next,uVar14 * 8);
          if (local_d8[1]._M_next < p_Var5 && strings <= local_d8[1]._M_next) {
            p_Var6 = (_List_node_base *)operator_new(0x18);
            p_Var6[1]._M_next = local_d8[1]._M_next;
          }
          else {
            p_Var6 = (_List_node_base *)operator_new(0x18);
            p_Var6[1]._M_next = local_d8[1]._M_next;
          }
          std::__detail::_List_node_base::_M_hook(p_Var6);
          multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_.
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size + 1;
          p_Var6 = local_a8;
        }
        uVar12 = uVar12 + uVar14;
        p_Var13 = p_Var13 + 0x40;
      } while (p_Var13 < p_Var6);
    }
    depth_00 = local_90;
    lVar10 = local_58 + 1;
    p_Var6 = multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             super__List_node_base._M_next;
    ppppuVar3 = local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                _M_impl.super__Vector_impl_data._M_start;
    n_00 = local_68;
    n_01 = local_60;
    if (lVar10 == 3) {
      while (local_68 = n_00, local_60 = n_01,
            p_Var6 != (_List_node_base *)
                      &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)
                       ::freeblocks_abi_cxx11_) {
        p_Var5 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                  &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
        super__Vector_impl_data._M_start = ppppuVar3;
        operator_delete(p_Var6);
        p_Var6 = p_Var5;
        ppppuVar3 = local_c8.
                    super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        n_00 = local_68;
        n_01 = local_60;
      }
      multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_;
      multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           &multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_;
      multikey_block<1024u,unsigned_char>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node._M_size = 0;
      local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ppppuVar3 != (pointer)0x0) {
        operator_delete(ppppuVar3);
      }
      multikey_block<1024u,unsigned_char>(strings,n_01,depth_00);
      if (aVar4 != (allocator_type)0x0) {
        multikey_block<1024u,unsigned_char>(strings + n_01,n_00,depth_00 + 1);
      }
      multikey_block<1024u,unsigned_char>(strings + n_01 + n_00,local_70,depth_00);
      if (local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

static void
multikey_block(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 10000) {
		mkqsort(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, 32*B> temp_space;
	static FreeBlocks freeblocks;
	const CharT partval = pseudo_median<CharT>(strings, n, depth);
	BackLinks backlinks(n/B+1);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	buckets[0].clear();
	buckets[1].clear();
	buckets[2].clear();
	// Initialize our list of free blocks.
	assert(freeblocks.empty());
	for (size_t i=0; i < 32; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-n%B; i+=B)
		freeblocks.push_back(strings+i);
	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const CharT c = cache[j];
			const unsigned b = get_bucket(c, partval);
			if (bucketsize[b] % B == 0) {
				Block block = take_free_block(freeblocks);
				buckets[b].push_back(block);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (block >= strings && block < strings+n) {
					backlinks[(block-strings)/B] =
						&(buckets[b].back());
				}
			}
			assert(not buckets[b].empty());
			buckets[b].back()[bucketsize[b] % B] = strings[i+j];
			++bucketsize[b];
		}
	}
	for (; i < n; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		if (bucketsize[b] % B == 0) {
			Block block = take_free_block(freeblocks);
			buckets[b].push_back(block);
			// Backlinks must be set for those blocks, that
			// use the original string array space.
			if (block >= strings && block < strings+n) {
				backlinks[(block-strings)/B] =
					&(buckets[b].back());
			}
		}
		assert(not buckets[b].empty());
		buckets[b].back()[bucketsize[b] % B] = strings[i];
		++bucketsize[b];
	}
	assert(bucketsize[0]+bucketsize[1]+bucketsize[2]==n);
	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 3; ++i) {
		if (bucketsize[i] == 0) continue;
		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;
			if (*it == (strings+pos)) {
				// Already at correct place.
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}
			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}
			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}
			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));
			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}
			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear(); BackLinks().swap(backlinks);
	multikey_block<B, CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_block<B, CharT>(strings+bucketsize[0], bucketsize[1],
				depth+sizeof(CharT));
	multikey_block<B, CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}